

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::CullingTestInstance::iterate
          (TestStatus *__return_storage_ptr__,CullingTestInstance *this)

{
  undefined8 *puVar1;
  Vec4 *pVVar2;
  deUint32 width;
  uint uVar3;
  VkPrimitiveTopology VVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Context *pCVar7;
  pointer pVVar8;
  TestStatus *pTVar9;
  bool bVar10;
  bool bVar11;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  NotSupportedError *this_00;
  Vec4 *pVVar12;
  ulong uVar13;
  long lVar14;
  CullingTestInstance *pCVar15;
  TestInstance *v1;
  Vec4 *pVVar16;
  TestInstance *v0_00;
  long lVar17;
  Vec4 *v0;
  int iVar18;
  ulong uVar19;
  long lVar20;
  float fVar21;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  triangles;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_> points;
  vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> lines;
  RasterizationArguments args;
  Surface resultImage;
  Random rnd;
  IVec4 colorBits;
  VkPhysicalDeviceFeatures deviceFeatures;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_368;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_348;
  vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
  local_328;
  CullingTestInstance *local_308;
  uint local_2fc;
  vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> local_2f8;
  RasterizationArguments local_2d8;
  Surface local_2c0;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [16];
  _func_int **local_288;
  Context *pCStack_280;
  float local_278 [12];
  bool local_248;
  bool local_247;
  bool local_246;
  ios_base local_230 [264];
  TestStatus *local_128;
  VkFrontFace local_11c [4];
  VkPhysicalDeviceFeatures local_10c;
  
  width = (this->super_BaseRenderingTestInstance).m_renderSize;
  tcu::Surface::Surface(&local_2c0,width,width);
  local_348.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_348.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_368.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.
  super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328.
  super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.
  super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vk = Context::getInstanceInterface
                 ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  physicalDevice =
       Context::getPhysicalDevice
                 ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  ::vk::getPhysicalDeviceFeatures(&local_10c,vk,physicalDevice);
  if ((local_10c.fillModeNonSolid != 0) || (1 < this->m_polygonMode - VK_POLYGON_MODE_LINE)) {
    deRandom_init((deRandom *)local_2a8,0x849ea);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (&local_348,6);
    if (0 < (int)((ulong)((long)local_348.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_348.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
      lVar14 = 0;
      lVar17 = 0;
      do {
        fVar21 = deRandom_getFloat((deRandom *)local_2a8);
        *(float *)((long)&(((BaseRenderingTestInstance *)
                           (local_348.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data)->super_TestInstance)
                          ._vptr_TestInstance + lVar14) = fVar21 * 1.8 + -0.9;
        fVar21 = deRandom_getFloat((deRandom *)local_2a8);
        *(float *)((long)&(((BaseRenderingTestInstance *)
                           (local_348.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data)->super_TestInstance)
                          ._vptr_TestInstance + lVar14 + 4) = fVar21 * 1.8 + -0.9;
        *(undefined8 *)
         ((long)&(((BaseRenderingTestInstance *)
                  (local_348.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_data)->super_TestInstance).
                 m_context + lVar14) = 0x3f80000000000000;
        lVar17 = lVar17 + 1;
        lVar14 = lVar14 + 0x10;
      } while (lVar17 < (int)((ulong)((long)local_348.
                                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_348.
                                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4));
    }
    uVar3 = this->m_cullMode;
    pVVar12 = (Vec4 *)(ulong)uVar3;
    local_308 = this;
    local_128 = __return_storage_ptr__;
    if (uVar3 != 3) {
      bVar11 = (uVar3 == 1) != (this->m_frontFace == VK_FRONT_FACE_COUNTER_CLOCKWISE);
      VVar4 = this->m_primitiveTopology;
      if (VVar4 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
        if (0 < (int)((ulong)((long)local_348.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_348.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2) {
          iVar18 = 0;
          do {
            pCVar15 = (CullingTestInstance *)
                      (&((BaseRenderingTestInstance *)
                        (local_348.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data)->super_TestInstance +
                      iVar18);
            v0_00 = &((BaseRenderingTestInstance *)
                     (local_348.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data)->super_TestInstance +
                    (iVar18 + 1);
            v1 = &((BaseRenderingTestInstance *)
                  (local_348.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_data)->super_TestInstance +
                 (int)(iVar18 + 2U);
            bVar10 = triangleOrder(pCVar15,(Vec4 *)v0_00,(Vec4 *)v1,(Vec4 *)(ulong)(iVar18 + 2U));
            if (bVar11 != bVar10) {
              local_278[8] = 0.0;
              local_278[9] = 0.0;
              local_278[10] = 0.0;
              local_278[0xb] = 0.0;
              local_278[4] = 0.0;
              local_278[5] = 0.0;
              local_278[6] = 0.0;
              local_278[7] = 0.0;
              local_278[0] = 0.0;
              local_278[1] = 0.0;
              local_278[2] = 0.0;
              local_278[3] = 0.0;
              local_2a8 = (undefined1  [8])
                          (pCVar15->super_BaseRenderingTestInstance).super_TestInstance.
                          _vptr_TestInstance;
              pCVar7 = (pCVar15->super_BaseRenderingTestInstance).super_TestInstance.m_context;
              fStack_2a0 = SUB84(pCVar7,0);
              fStack_29c = (float)((ulong)pCVar7 >> 0x20);
              local_248 = false;
              local_298._0_4_ = SUB84(v0_00->_vptr_TestInstance,0);
              local_298._4_4_ = (undefined4)((ulong)v0_00->_vptr_TestInstance >> 0x20);
              local_298._8_4_ = SUB84(v0_00->m_context,0);
              local_298._12_4_ = (undefined4)((ulong)v0_00->m_context >> 0x20);
              local_247 = false;
              local_288 = v1->_vptr_TestInstance;
              pCStack_280 = v1->m_context;
              local_246 = false;
              std::
              vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ::push_back(&local_368,(value_type *)local_2a8);
            }
            iVar18 = iVar18 + 3;
          } while (iVar18 < (int)((ulong)((long)local_348.
                                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_348.
                                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2
                  );
        }
      }
      else if (VVar4 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
        if (0 < (int)((ulong)((long)local_348.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_348.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2) {
          pVVar12 = (Vec4 *)(ulong)bVar11;
          local_2fc = (uint)bVar11;
          lVar14 = 0x200000000;
          lVar20 = 0x10;
          lVar17 = 0;
          do {
            pVVar8 = local_348.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pVVar2 = (Vec4 *)((long)&(((BaseRenderingTestInstance *)
                                      (local_348.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_data)->
                                     super_TestInstance)._vptr_TestInstance + lVar20);
            pCVar15 = (CullingTestInstance *)
                      ((long)local_348.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar20 + -0x10);
            pVVar16 = (Vec4 *)((long)&(((BaseRenderingTestInstance *)
                                       (local_348.
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_data)->
                                      super_TestInstance)._vptr_TestInstance + (lVar14 >> 0x1c));
            bVar11 = triangleOrder(pCVar15,pVVar2,pVVar16,pVVar12);
            if (((uint)lVar17 & 1 ^ local_2fc) != (uint)bVar11) {
              local_278[8] = 0.0;
              local_278[9] = 0.0;
              local_278[10] = 0.0;
              local_278[0xb] = 0.0;
              local_278[4] = 0.0;
              local_278[5] = 0.0;
              local_278[6] = 0.0;
              local_278[7] = 0.0;
              local_278[0] = 0.0;
              local_278[1] = 0.0;
              local_278[2] = 0.0;
              local_278[3] = 0.0;
              local_2a8 = (undefined1  [8])
                          (pCVar15->super_BaseRenderingTestInstance).super_TestInstance.
                          _vptr_TestInstance;
              uVar5 = *(undefined8 *)((long)pVVar8 + lVar20 + -8);
              fStack_2a0 = (float)uVar5;
              fStack_29c = (float)((ulong)uVar5 >> 0x20);
              local_248 = false;
              local_298._0_4_ = (undefined4)*(undefined8 *)pVVar2->m_data;
              local_298._4_4_ = (undefined4)((ulong)*(undefined8 *)pVVar2->m_data >> 0x20);
              local_298._8_4_ = (undefined4)*(undefined8 *)(pVVar2->m_data + 2);
              local_298._12_4_ = (undefined4)((ulong)*(undefined8 *)(pVVar2->m_data + 2) >> 0x20);
              local_247 = false;
              local_288 = *(_func_int ***)pVVar16->m_data;
              pCStack_280 = *(Context **)(pVVar16->m_data + 2);
              local_246 = false;
              std::
              vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ::push_back(&local_368,(value_type *)local_2a8);
            }
            lVar17 = lVar17 + 1;
            pVVar12 = (Vec4 *)(((long)local_348.
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_348.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 +
                               -0x200000000 >> 0x20);
            lVar14 = lVar14 + 0x100000000;
            lVar20 = lVar20 + 0x10;
          } while (lVar17 < (long)pVVar12);
        }
      }
      else if ((VVar4 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN) &&
              (1 < (int)((ulong)((long)local_348.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_348.
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1)) {
        lVar14 = 1;
        lVar17 = 0x20;
        do {
          pVVar8 = local_348.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pVVar2 = (Vec4 *)((long)&(((BaseRenderingTestInstance *)
                                    (local_348.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_data)->
                                   super_TestInstance)._vptr_TestInstance + lVar17);
          pVVar16 = (Vec4 *)((long)local_348.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar17 + -0x10);
          bVar10 = triangleOrder((CullingTestInstance *)
                                 local_348.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,pVVar16,pVVar2,pVVar12);
          if (bVar11 != bVar10) {
            local_278[8] = 0.0;
            local_278[9] = 0.0;
            local_278[10] = 0.0;
            local_278[0xb] = 0.0;
            local_278[4] = 0.0;
            local_278[5] = 0.0;
            local_278[6] = 0.0;
            local_278[7] = 0.0;
            local_278[0] = 0.0;
            local_278[1] = 0.0;
            local_278[2] = 0.0;
            local_278[3] = 0.0;
            local_2a8 = (undefined1  [8])
                        (((BaseRenderingTestInstance *)pVVar8->m_data)->super_TestInstance).
                        _vptr_TestInstance;
            pCVar7 = (((BaseRenderingTestInstance *)pVVar8->m_data)->super_TestInstance).m_context;
            fStack_2a0 = SUB84(pCVar7,0);
            fStack_29c = (float)((ulong)pCVar7 >> 0x20);
            local_248 = false;
            uVar5 = *(undefined8 *)pVVar16->m_data;
            uVar6 = *(undefined8 *)((long)pVVar8 + lVar17 + -8);
            local_298._0_4_ = (undefined4)uVar5;
            local_298._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
            local_298._8_4_ = (undefined4)uVar6;
            local_298._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
            local_247 = false;
            local_288 = *(_func_int ***)pVVar2->m_data;
            pCStack_280 = *(Context **)(pVVar2->m_data + 2);
            local_246 = false;
            std::
            vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            ::push_back(&local_368,(value_type *)local_2a8);
          }
          lVar14 = lVar14 + 1;
          pVVar12 = (Vec4 *)0xffffffff00000000;
          lVar17 = lVar17 + 0x10;
        } while (lVar14 < ((long)local_348.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_348.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 +
                          -0x100000000 >> 0x20);
      }
    }
    if (local_308->m_polygonMode == VK_POLYGON_MODE_POINT) {
      if (0 < (int)((ulong)((long)local_368.
                                  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_368.
                                 super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x3d70a3d7) {
        lVar14 = 0;
        uVar19 = 0;
        do {
          lVar17 = 0;
          do {
            local_298._0_4_ = 0.0;
            local_298._4_4_ = 0.0;
            local_298._8_4_ = 0.0;
            local_298._12_4_ = 0.0;
            uVar13 = ((long)local_368.
                            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_368.
                            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x70a3d70a3d70a3d7;
            if (uVar13 < uVar19 || uVar13 - uVar19 == 0) goto LAB_007e75a7;
            puVar1 = (undefined8 *)
                     ((long)(local_368.
                             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                             ._M_impl.super__Vector_impl_data._M_start)->positions[0].m_data +
                     lVar17 + lVar14);
            local_2a8 = (undefined1  [8])*puVar1;
            uVar5 = puVar1[1];
            fStack_2a0 = (float)uVar5;
            fStack_29c = (float)((ulong)uVar5 >> 0x20);
            local_288 = (_func_int **)CONCAT44(local_288._4_4_,0x3f800000);
            std::
            vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
            ::push_back(&local_328,(value_type *)local_2a8);
            lVar17 = lVar17 + 0x10;
          } while (lVar17 != 0x30);
          uVar19 = uVar19 + 1;
          lVar14 = lVar14 + 100;
        } while ((long)uVar19 <
                 (long)((int)((ulong)((long)local_368.
                                            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_368.
                                           super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                       -0x3d70a3d7));
      }
    }
    else if ((local_308->m_polygonMode == VK_POLYGON_MODE_LINE) &&
            (0 < (int)((ulong)((long)local_368.
                                     super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_368.
                                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x3d70a3d7))
    {
      lVar14 = 0x10;
      uVar19 = 0;
      do {
        lVar17 = -0x10;
        do {
          local_278[0] = 0.0;
          local_278[1] = 0.0;
          local_278[2] = 0.0;
          local_278[3] = 0.0;
          local_288 = (_func_int **)0x0;
          pCStack_280 = (Context *)0x0;
          uVar13 = ((long)local_368.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_368.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x70a3d70a3d70a3d7;
          if (uVar13 < uVar19 || uVar13 - uVar19 == 0) goto LAB_007e75a7;
          puVar1 = (undefined8 *)
                   ((long)(local_368.
                           super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           ._M_impl.super__Vector_impl_data._M_start)->positions[0].m_data +
                   lVar17 + lVar14);
          local_2a8 = (undefined1  [8])*puVar1;
          uVar5 = puVar1[1];
          fStack_2a0 = (float)uVar5;
          fStack_29c = (float)((ulong)uVar5 >> 0x20);
          puVar1 = (undefined8 *)
                   ((long)(local_368.
                           super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           ._M_impl.super__Vector_impl_data._M_start)->positions[1].m_data +
                   lVar14 + lVar17);
          uVar5 = *puVar1;
          uVar6 = puVar1[1];
          local_298._0_4_ = (undefined4)uVar5;
          local_298._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
          local_298._8_4_ = (undefined4)uVar6;
          local_298._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
          std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
          ::push_back(&local_2f8,(value_type *)local_2a8);
          lVar17 = lVar17 + 0x10;
        } while (lVar17 == 0);
        local_278[0] = 0.0;
        local_278[1] = 0.0;
        local_278[2] = 0.0;
        local_278[3] = 0.0;
        local_288 = (_func_int **)0x0;
        pCStack_280 = (Context *)0x0;
        uVar13 = ((long)local_368.
                        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_368.
                        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x70a3d70a3d70a3d7;
        if (uVar13 < uVar19 || uVar13 - uVar19 == 0) goto LAB_007e75a7;
        local_2a8 = *(undefined1 (*) [8])
                     local_368.
                     super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar19].positions[2].m_data;
        uVar5 = *(undefined8 *)
                 (local_368.
                  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar19].positions[2].m_data + 2);
        fStack_2a0 = (float)uVar5;
        fStack_29c = (float)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)
                 local_368.
                 super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar19].positions[0].m_data;
        uVar6 = *(undefined8 *)
                 (local_368.
                  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar19].positions[0].m_data + 2);
        local_298._0_4_ = (undefined4)uVar5;
        local_298._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
        local_298._8_4_ = (undefined4)uVar6;
        local_298._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
        std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
        push_back(&local_2f8,(value_type *)local_2a8);
        uVar19 = uVar19 + 1;
        lVar14 = lVar14 + 100;
      } while ((long)uVar19 <
               (long)((int)((ulong)((long)local_368.
                                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_368.
                                         super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                     -0x3d70a3d7));
    }
    pCVar15 = local_308;
    local_2a8 = (undefined1  [8])
                ((local_308->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_2a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&fStack_2a0,"Setting front face to ",0x16);
    pTVar9 = local_128;
    local_2d8.redBits = pCVar15->m_frontFace;
    local_2d8._0_8_ = ::vk::getFrontFaceName;
    tcu::Format::Enum<vk::VkFrontFace,_4UL>::toStream
              ((Enum<vk::VkFrontFace,_4UL> *)&local_2d8,(ostream *)&fStack_2a0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_2a0);
    std::ios_base::~ios_base(local_230);
    local_2a8 = (undefined1  [8])
                ((pCVar15->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx
                ->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_2a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&fStack_2a0,"Setting cull face to ",0x15);
    std::ostream::_M_insert<unsigned_long>((ulong)&fStack_2a0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_2a0);
    std::ios_base::~ios_base(local_230);
    local_2a8 = (undefined1  [8])
                ((pCVar15->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx
                ->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_2a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&fStack_2a0,"Drawing test pattern (",0x16);
    local_2d8.redBits = pCVar15->m_primitiveTopology;
    local_2d8._0_8_ = ::vk::getPrimitiveTopologyName;
    tcu::Format::Enum<vk::VkPrimitiveTopology,_4UL>::toStream
              ((Enum<vk::VkPrimitiveTopology,_4UL> *)&local_2d8,(ostream *)&fStack_2a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_2a0,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_2a0);
    std::ios_base::~ios_base(local_230);
    BaseRenderingTestInstance::drawPrimitives
              (&pCVar15->super_BaseRenderingTestInstance,&local_2c0,&local_348,
               pCVar15->m_primitiveTopology);
    tcu::getTextureFormatBitDepth
              ((tcu *)local_11c,&(pCVar15->super_BaseRenderingTestInstance).m_textureFormat);
    local_2d8.subpixelBits = (pCVar15->super_BaseRenderingTestInstance).m_subpixelBits;
    local_2d8.numSamples = (uint)pCVar15->m_multisampling;
    local_2d8.redBits = local_11c[0];
    local_2d8.greenBits = local_11c[1];
    local_2d8.blueBits = local_11c[2];
    if (pCVar15->m_polygonMode == VK_POLYGON_MODE_LINE) {
      local_298._8_4_ = 0.0;
      local_2a8 = (undefined1  [8])
                  local_2f8.
                  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      fStack_2a0 = SUB84(local_2f8.
                         super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                         ._M_impl.super__Vector_impl_data._M_finish,0);
      fStack_29c = (float)((ulong)local_2f8.
                                  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                  ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
      local_298._0_4_ =
           SUB84(local_2f8.
                 super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      local_298._4_4_ =
           (undefined4)
           ((ulong)local_2f8.
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
      local_2f8.
      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2f8.
      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2f8.
      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar11 = tcu::verifyLineGroupRasterization
                         (&local_2c0,(LineSceneSpec *)local_2a8,&local_2d8,
                          ((pCVar15->super_BaseRenderingTestInstance).super_TestInstance.m_context)
                          ->m_testCtx->m_log);
    }
    else if (pCVar15->m_polygonMode == VK_POLYGON_MODE_POINT) {
      local_2a8 = (undefined1  [8])
                  local_328.
                  super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      fStack_2a0 = SUB84(local_328.
                         super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                         ._M_impl.super__Vector_impl_data._M_finish,0);
      fStack_29c = (float)((ulong)local_328.
                                  super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                                  ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
      local_298._0_4_ =
           SUB84(local_328.
                 super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      local_298._4_4_ =
           (undefined4)
           ((ulong)local_328.
                   super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
      local_328.
      super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_328.
      super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_328.
      super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar11 = tcu::verifyPointGroupRasterization
                         (&local_2c0,(PointSceneSpec *)local_2a8,&local_2d8,
                          ((pCVar15->super_BaseRenderingTestInstance).super_TestInstance.m_context)
                          ->m_testCtx->m_log);
    }
    else {
      local_2a8 = (undefined1  [8])
                  local_368.
                  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      fStack_2a0 = SUB84(local_368.
                         super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                         ._M_impl.super__Vector_impl_data._M_finish,0);
      fStack_29c = (float)((ulong)local_368.
                                  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                  ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
      local_298._0_4_ =
           SUB84(local_368.
                 super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      local_298._4_4_ =
           (undefined4)
           ((ulong)local_368.
                   super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
      local_368.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_368.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_368.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar11 = tcu::verifyTriangleGroupRasterization
                         (&local_2c0,(TriangleSceneSpec *)local_2a8,&local_2d8,
                          ((pCVar15->super_BaseRenderingTestInstance).super_TestInstance.m_context)
                          ->m_testCtx->m_log,VERIFICATIONMODE_WEAK);
    }
    if (local_2a8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_2a8,CONCAT44(local_298._4_4_,local_298._0_4_) - (long)local_2a8)
      ;
    }
    local_2a8 = (undefined1  [8])local_298;
    if (bVar11 == false) {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"Incorrect rendering","");
      pTVar9->m_code = QP_TEST_RESULT_FAIL;
      (pTVar9->m_description)._M_dataplus._M_p = (pointer)&(pTVar9->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pTVar9->m_description,local_2a8,
                 (undefined1 *)((long)((Vec4 *)local_2a8)->m_data + CONCAT44(fStack_29c,fStack_2a0))
                );
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"Pass","");
      pTVar9->m_code = QP_TEST_RESULT_PASS;
      (pTVar9->m_description)._M_dataplus._M_p = (pointer)&(pTVar9->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pTVar9->m_description,local_2a8,
                 (undefined1 *)((long)((Vec4 *)local_2a8)->m_data + CONCAT44(fStack_29c,fStack_2a0))
                );
    }
    if (local_2a8 != (undefined1  [8])local_298) {
      operator_delete((void *)local_2a8,CONCAT44(local_298._4_4_,local_298._0_4_) + 1);
    }
    if ((pointer)local_2f8.
                 super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2f8.
                      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2f8.
                            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2f8.
                            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_328.
                 super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                 ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_328.
                      super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_328.
                            super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_328.
                            super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_368.
        super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_368.
                      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_368.
                            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_368.
                            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((CullingTestInstance *)
        local_348.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (CullingTestInstance *)0x0) {
      operator_delete(local_348.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_348.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_348.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&local_2c0);
    return pTVar9;
  }
LAB_007e75b8:
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Wireframe fill modes are not supported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
             ,0x80c);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
LAB_007e75a7:
  local_298._12_4_ = 0.0;
  local_298._8_4_ = 0.0;
  local_298._4_4_ = 0.0;
  local_298._0_4_ = 0.0;
  fStack_29c = 0.0;
  fStack_2a0 = 0.0;
  local_2a8 = (undefined1  [8])0x0;
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar19);
  goto LAB_007e75b8;
}

Assistant:

tcu::TestStatus CullingTestInstance::iterate (void)
{
	DE_ASSERT(m_polygonMode < VK_POLYGON_MODE_LAST);

	tcu::Surface									resultImage						(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;
	std::vector<PointSceneSpec::ScenePoint>			points;
	std::vector<LineSceneSpec::SceneLine>			lines;

	const InstanceInterface&						vk				= m_context.getInstanceInterface();
	const VkPhysicalDevice							physicalDevice	= m_context.getPhysicalDevice();
	const VkPhysicalDeviceFeatures					deviceFeatures	= getPhysicalDeviceFeatures(vk, physicalDevice);

	if (!(deviceFeatures.fillModeNonSolid) && (m_polygonMode == VK_POLYGON_MODE_LINE || m_polygonMode == VK_POLYGON_MODE_POINT))
		TCU_THROW(NotSupportedError, "Wireframe fill modes are not supported");

	// generate scene
	generateVertices(drawBuffer);
	extractTriangles(triangles, drawBuffer);

	if (m_polygonMode == VK_POLYGON_MODE_LINE)
		extractLines(triangles ,lines);
	else if (m_polygonMode == VK_POLYGON_MODE_POINT)
		extractPoints(triangles, points);

	// draw image
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Setting front face to " << m_frontFace << tcu::TestLog::EndMessage;
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Setting cull face to " << m_cullMode << tcu::TestLog::EndMessage;
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Drawing test pattern (" << m_primitiveTopology << ")" << tcu::TestLog::EndMessage;

		drawPrimitives(resultImage, drawBuffer, m_primitiveTopology);
	}

	// compare
	{
		RasterizationArguments	args;
		tcu::IVec4				colorBits	= tcu::getTextureFormatBitDepth(getTextureFormat());
		bool					isCompareOk	= false;

		args.numSamples		= m_multisampling ? 1 : 0;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= colorBits[0];
		args.greenBits		= colorBits[1];
		args.blueBits		= colorBits[2];

		switch (m_polygonMode)
		{
			case VK_POLYGON_MODE_LINE:
			{
				LineSceneSpec scene;
				scene.lineWidth = 0;
				scene.lines.swap(lines);
				isCompareOk = verifyLineGroupRasterization(resultImage, scene, args, m_context.getTestContext().getLog());
				break;
			}
			case VK_POLYGON_MODE_POINT:
			{
				PointSceneSpec scene;
				scene.points.swap(points);
				isCompareOk = verifyPointGroupRasterization(resultImage, scene, args, m_context.getTestContext().getLog());
				break;
			}
			default:
			{
				TriangleSceneSpec scene;
				scene.triangles.swap(triangles);
				isCompareOk = verifyTriangleGroupRasterization(resultImage, scene, args, m_context.getTestContext().getLog(), tcu::VERIFICATIONMODE_WEAK);
				break;
			}
		}

		if (isCompareOk)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Incorrect rendering");
	}
}